

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::ApprovalTestNamer::getSourceFileName_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  pointer pcVar1;
  TestName *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  string file;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pTVar2 = getCurrentTest();
  TestName::checkBuildConfiguration(&pTVar2->fileName);
  pcVar1 = (pTVar2->fileName)._M_dataplus._M_p;
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (pTVar2->fileName)._M_string_length);
  SystemUtils::getDirectorySeparator_abi_cxx11_();
  ::std::__cxx11::string::rfind
            ((char *)local_48,(ulong)local_68._M_dataplus._M_p,0xffffffffffffffff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  ::std::__cxx11::string::rfind((char)local_48,0x2e);
  ::std::__cxx11::string::substr((ulong)&local_68,(ulong)local_48);
  convertToFileName(__return_storage_ptr__,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getSourceFileName() const
    {
        auto file = getCurrentTest().getFileName();
        auto start = file.rfind(SystemUtils::getDirectorySeparator()) + 1;
        auto end = file.rfind('.');
        auto fileName = file.substr(start, end - start);
        return convertToFileName(fileName);
    }